

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O1

_Bool new_player_spot(chunk_conflict *c,player *p)

{
  loc lVar1;
  loc grid_00;
  player *p_00;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  loc_conflict top_left;
  loc_conflict bottom_right;
  int *state;
  int iVar6;
  bool bVar7;
  loc_conflict grid;
  loc local_40;
  player *local_38;
  
  local_38 = p;
  if ((((p->opts).opt[0x2a] == true) &&
      (lVar1.x = (p->grid).x, lVar1.y = (p->grid).y, _Var2 = square_in_bounds_fully(c,lVar1), _Var2)
      ) && (grid_00.x = (p->grid).x, grid_00.y = (p->grid).y, _Var2 = square_isstairs(c,grid_00),
           _Var2)) {
    local_40.x = (p->grid).x;
    local_40.y = (p->grid).y;
  }
  else {
    top_left = loc(1,1);
    bottom_right = loc(c->width + -2,c->height + -2);
    state = cave_find_init(top_left,bottom_right);
    _Var2 = cave_find_get_grid((loc_conflict *)&local_40,state);
    if (_Var2) {
      do {
        _Var2 = square_suits_stairs_well(c,local_40);
        if (_Var2) goto LAB_00159804;
        _Var3 = cave_find_get_grid((loc_conflict *)&local_40,state);
      } while (_Var3);
    }
    else {
      _Var2 = false;
    }
    state[4] = 0;
    if ((_Var2 == false) && (_Var3 = cave_find_get_grid((loc_conflict *)&local_40,state), _Var3)) {
      do {
        _Var2 = square_suits_stairs_ok(c,local_40);
        if (_Var2) break;
        _Var3 = cave_find_get_grid((loc_conflict *)&local_40,state);
      } while (_Var3);
    }
LAB_00159804:
    if (_Var2 == false) {
      iVar6 = 6;
      do {
        state[4] = 0;
        while ((_Var2 == false &&
               (_Var3 = cave_find_get_grid((loc_conflict *)&local_40,state), lVar1 = local_40, _Var3
               ))) {
          _Var3 = square_isempty(c,local_40);
          if ((_Var3) &&
             ((_Var3 = square_isvault(c,lVar1), !_Var3 &&
              (_Var3 = square_isno_stairs(c,lVar1), !_Var3)))) {
            wVar4 = square_num_walls_adjacent(c,lVar1);
            wVar5 = square_num_walls_diagonal(c,lVar1);
            _Var2 = wVar5 + wVar4 == iVar6;
          }
        }
        bVar7 = iVar6 != 0;
        iVar6 = iVar6 + -1;
      } while ((_Var2 == false) && (bVar7));
    }
    mem_free(state);
    if (_Var2 == false) {
      msg("Failed to place player; please report.  Restarting generation.");
      dump_level_simple((char *)0x0,"Player Placement Failure",c);
      return false;
    }
  }
  p_00 = local_38;
  if (((local_38->opts).opt[0x1e] == true) &&
     ((wVar4 = local_38->upkeep->create_stair, wVar5 = FEAT_MORE, wVar4 == FEAT_MORE ||
      (wVar5 = FEAT_LESS, wVar4 == FEAT_LESS)))) {
    square_set_feat(c,local_40,wVar5);
  }
  player_place((chunk_conflict2 *)c,p_00,(loc_conflict)local_40);
  return true;
}

Assistant:

bool new_player_spot(struct chunk *c, struct player *p)
{
	struct loc grid;

	/* Try to find a good place to put the player */
	if (OPT(p, birth_levels_persist) &&
			square_in_bounds_fully(c, p->grid) &&
			square_isstairs(c, p->grid)) {
		grid = p->grid;
	} else if (!find_start(c, &grid)) {
		msg("Failed to place player; please report.  Restarting generation.");
		dump_level_simple(NULL, "Player Placement Failure", c);
		return false;
	}

	/* Create stairs the player came down if allowed and necessary */
	if (!OPT(p, birth_connect_stairs))
		;
	else if (p->upkeep->create_stair == FEAT_MORE)
		square_set_feat(c, grid, FEAT_MORE);
	else if (p->upkeep->create_stair == FEAT_LESS)
		square_set_feat(c, grid, FEAT_LESS);

	player_place(c, p, grid);
	return true;
}